

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpikingPopulation.h
# Opt level: O2

void __thiscall
SpikingPopulation::SpikingPopulation(SpikingPopulation *this,int amount,string *type)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)type);
  Population::Population(&this->super_Population,amount,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->super_Population)._vptr_Population = (_func_int **)&PTR_update_00111cf0;
  return;
}

Assistant:

SpikingPopulation(int amount, std::string type) : Population(amount, type) { }